

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

void bounty_credit(CHAR_DATA *ch,int credit)

{
  short *psVar1;
  int *piVar2;
  short sVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  char buf [300];
  char buf2 [300];
  char blog [500];
  char acStack_488 [304];
  char local_358 [304];
  char local_228 [504];
  
  sVar3 = ch->pcdata->bounty_credits;
  bVar5 = is_npc(ch);
  if (!bVar5) {
    sprintf(acStack_488,"You receive %i bounty credits for your kill!\n\r",(ulong)(uint)credit);
    send_to_char(acStack_488,ch);
    psVar1 = &ch->pcdata->bounty_credits;
    *psVar1 = *psVar1 + (short)credit;
    lVar6 = 0;
    do {
      iVar4 = *(int *)((long)&bounty_table[1].credits_required + lVar6);
      if ((iVar4 <= ch->pcdata->bounty_credits) && (sVar3 < iVar4)) {
        sprintf(acStack_488,"You gain a title within the Bounty Guild, advancing to %s!\n\r",
                *(undefined8 *)((long)&bounty_table[1].rank_extitle + lVar6));
        send_to_char(acStack_488,ch);
        sprintf(local_358,", %s",*(undefined8 *)((long)&bounty_table[1].rank_extitle + lVar6));
        set_extitle(ch,local_358);
        sprintf(local_358,"%s has advanced to the position of %s.",ch->name,
                *(undefined8 *)((long)&bounty_table[1].rank_extitle + lVar6));
        bounty_cb(local_358);
        sprintf(local_228,"%s advances to %s.",ch->name,
                *(undefined8 *)((long)&bounty_table[1].rank_extitle + lVar6));
        bounty_log(local_228);
        piVar2 = &ch->pcdata->cabal_level;
        *piVar2 = *piVar2 + 1;
        update_cskills(ch);
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x60);
  }
  return;
}

Assistant:

void bounty_credit(CHAR_DATA *ch, int credit)
{
	char buf[300], buf2[300], blog[500];
	int i, old_credit = ch->pcdata->bounty_credits;

	if (is_npc(ch))
		return;

	sprintf(buf, "You receive %i bounty credits for your kill!\n\r", credit);
	send_to_char(buf, ch);
	ch->pcdata->bounty_credits += credit;

	for (i = 1; i < MAX_BOUNTY; i++)
	{
		if (ch->pcdata->bounty_credits >= bounty_table[i].credits_required
			&& old_credit < bounty_table[i].credits_required)
		{
			sprintf(buf, "You gain a title within the Bounty Guild, advancing to %s!\n\r", bounty_table[i].rank_extitle);
			send_to_char(buf, ch);

			sprintf(buf2, ", %s", bounty_table[i].rank_extitle);
			set_extitle(ch, buf2);

			sprintf(buf2, "%s has advanced to the position of %s.", ch->name, bounty_table[i].rank_extitle);
			bounty_cb(buf2);

			sprintf(blog, "%s advances to %s.", ch->name, bounty_table[i].rank_extitle);
			bounty_log(blog);

			ch->pcdata->cabal_level++;
			update_cskills(ch);
		}
	}
}